

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_beta_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < *out_size) {
    uVar2 = (ulong)(uint)*out_size;
  }
  if ((c->field_6).external.type == 0) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      out[uVar3] = -(c->field_6).byte_array_stop.stop;
    }
  }
  else {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = get_bits_MSB(in,(c->field_6).beta.nbits);
      out[uVar3] = (char)uVar1 - (char)(c->field_6).huffman.ncodes;
    }
  }
  return 0;
}

Assistant:

int cram_beta_decode_char(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = -c->beta.offset;
    }

    return 0;
}